

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_complete16(void *zSql)

{
  uint uVar1;
  Mem *pMem;
  char *zSql_00;
  
  uVar1 = sqlite3_initialize();
  if (uVar1 == 0) {
    pMem = (Mem *)sqlite3Malloc(0x38);
    if (pMem != (Mem *)0x0) {
      pMem->n = 0;
      pMem->flags = 0;
      pMem->enc = '\0';
      pMem->eSubtype = '\0';
      pMem->db = (sqlite3 *)0x0;
      pMem->szMalloc = 0;
      pMem->uTemp = 0;
      pMem->zMalloc = (char *)0x0;
      (pMem->u).r = 0.0;
      pMem->z = (char *)0x0;
      pMem->xDel = (_func_void_void_ptr *)0x0;
      pMem->flags = 1;
      pMem->db = (sqlite3 *)0x0;
      sqlite3VdbeMemSetStr(pMem,(char *)zSql,-1,'\x02',(_func_void_void_ptr *)0x0);
    }
    zSql_00 = (char *)sqlite3ValueText(pMem,'\x01');
    if (zSql_00 == (char *)0x0) {
      uVar1 = 7;
    }
    else {
      uVar1 = sqlite3_complete(zSql_00);
      uVar1 = uVar1 & 0xff;
    }
    sqlite3ValueFree(pMem);
  }
  return uVar1;
}

Assistant:

SQLITE_API int sqlite3_complete16(const void *zSql){
  sqlite3_value *pVal;
  char const *zSql8;
  int rc;

#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
  pVal = sqlite3ValueNew(0);
  sqlite3ValueSetStr(pVal, -1, zSql, SQLITE_UTF16NATIVE, SQLITE_STATIC);
  zSql8 = sqlite3ValueText(pVal, SQLITE_UTF8);
  if( zSql8 ){
    rc = sqlite3_complete(zSql8);
  }else{
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3ValueFree(pVal);
  return rc & 0xff;
}